

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::addDestinationTarget
          (CommonCore *this,InterfaceHandle handle,string_view dest,InterfaceType hint)

{
  byte bVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  pair<helics::route_id,_helics::ActionMessage> *ppVar6;
  InvalidIdentifier *this_00;
  HelicsException *this_01;
  char *pcVar7;
  action_t newAction;
  size_t sVar8;
  string_view string1;
  string_view string1_00;
  string_view message;
  string_view message_00;
  string_view string2;
  string_view string2_00;
  ActionMessage local_e8;
  
  sVar8 = dest._M_len;
  ppVar6 = getHandleInfo(this,handle);
  if (ppVar6 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "invalid handle";
    sVar8 = 0xe;
LAB_002b37c8:
    message._M_str = pcVar7;
    message._M_len = sVar8;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (((ppVar6->second).messageID & 0x40000000) != 0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar7 = "Interface is receive only and cannot have destination targets";
    sVar8 = 0x3d;
    goto LAB_002b37c8;
  }
  local_e8.payload.heap = (byte *)&local_e8.payload;
  local_e8.messageAction = cmd_ignore;
  local_e8.messageID = 0;
  local_e8.dest_id.gid = 0;
  local_e8.dest_handle.hid = -1700000000;
  local_e8.actionTime.internalTimeCode = 0;
  local_e8.Te.internalTimeCode = 0;
  local_e8.Tdemin.internalTimeCode = 0;
  local_e8.Tso.internalTimeCode = 0;
  local_e8.payload.buffer._M_elems[0] = 0;
  local_e8.payload.buffer._M_elems[1] = 0;
  local_e8.payload.buffer._M_elems[2] = 0;
  local_e8.payload.buffer._M_elems[3] = 0;
  local_e8.payload.buffer._M_elems[4] = 0;
  local_e8.payload.buffer._M_elems[5] = 0;
  local_e8.payload.buffer._M_elems[6] = 0;
  local_e8.payload.buffer._M_elems[7] = 0;
  local_e8.payload.buffer._M_elems[8] = 0;
  local_e8.payload.buffer._M_elems[9] = 0;
  local_e8.payload.buffer._M_elems[10] = 0;
  local_e8.payload.buffer._M_elems[0xb] = 0;
  local_e8.payload.buffer._M_elems[0xc] = 0;
  local_e8.payload.buffer._M_elems[0xd] = 0;
  local_e8.payload.buffer._M_elems[0xe] = 0;
  local_e8.payload.buffer._M_elems[0xf] = 0;
  local_e8.payload.buffer._M_elems[0x10] = 0;
  local_e8.payload.buffer._M_elems[0x11] = 0;
  local_e8.payload.buffer._M_elems[0x12] = 0;
  local_e8.payload.buffer._M_elems[0x13] = 0;
  local_e8.payload.buffer._M_elems[0x14] = 0;
  local_e8.payload.buffer._M_elems[0x15] = 0;
  local_e8.payload.buffer._M_elems[0x16] = 0;
  local_e8.payload.buffer._M_elems[0x17] = 0;
  local_e8.payload.buffer._M_elems[0x18] = 0;
  local_e8.payload.buffer._M_elems[0x19] = 0;
  local_e8.payload.buffer._M_elems[0x1a] = 0;
  local_e8.payload.buffer._M_elems[0x1b] = 0;
  local_e8.payload.buffer._M_elems[0x1c] = 0;
  local_e8.payload.buffer._M_elems[0x1d] = 0;
  local_e8.payload.buffer._M_elems[0x1e] = 0;
  local_e8.payload.buffer._M_elems[0x1f] = 0;
  local_e8.payload.buffer._M_elems[0x20] = 0;
  local_e8.payload.buffer._M_elems[0x21] = 0;
  local_e8.payload.buffer._M_elems[0x22] = 0;
  local_e8.payload.buffer._M_elems[0x23] = 0;
  local_e8.payload.buffer._M_elems[0x24] = 0;
  local_e8.payload.buffer._M_elems[0x25] = 0;
  local_e8.payload.buffer._M_elems[0x26] = 0;
  local_e8.payload.buffer._M_elems[0x27] = 0;
  local_e8.payload.buffer._M_elems[0x28] = 0;
  local_e8.payload.buffer._M_elems[0x29] = 0;
  local_e8.payload.buffer._M_elems[0x2a] = 0;
  local_e8.payload.buffer._M_elems[0x2b] = 0;
  local_e8.payload.buffer._M_elems[0x2c] = 0;
  local_e8.payload.buffer._M_elems[0x2d] = 0;
  local_e8.payload.buffer._M_elems[0x2e] = 0;
  local_e8.payload.buffer._M_elems[0x2f] = 0;
  local_e8.payload.buffer._M_elems[0x30] = 0;
  local_e8.payload.buffer._M_elems[0x31] = 0;
  local_e8.payload.buffer._M_elems[0x32] = 0;
  local_e8.payload.buffer._M_elems[0x33] = 0;
  local_e8.payload.buffer._M_elems[0x34] = 0;
  local_e8.payload.buffer._M_elems[0x35] = 0;
  local_e8.payload.buffer._M_elems[0x36] = 0;
  local_e8.payload.buffer._M_elems[0x37] = 0;
  local_e8.payload.buffer._M_elems[0x38] = 0;
  local_e8.payload.buffer._M_elems[0x39] = 0;
  local_e8.payload.buffer._M_elems[0x3a] = 0;
  local_e8.payload.buffer._M_elems[0x3b] = 0;
  local_e8.payload.buffer._M_elems[0x3c] = 0;
  local_e8.payload.buffer._M_elems[0x3d] = 0;
  local_e8.payload.buffer._M_elems[0x3e] = 0;
  local_e8.payload.buffer._M_elems[0x3f] = 0;
  local_e8.payload.bufferSize = 0;
  local_e8.payload.bufferCapacity = 0x40;
  local_e8.payload.nonOwning = false;
  local_e8.payload.locked = false;
  local_e8.payload.usingAllocatedBuffer = false;
  local_e8.payload.errorCondition = '\0';
  local_e8.payload.userKey = 0;
  local_e8.stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.stringData.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.source_id.gid = (ppVar6->first).rid;
  local_e8.source_handle.hid = *(BaseType *)&ppVar6->field_0x4;
  local_e8._24_8_ =
       (ulong)CONCAT22(*(undefined2 *)((long)&(ppVar6->second).messageID + 2),
                       (short)(char)(ppVar6->second).messageID) | 0x20000;
  if ((local_e8.payload.heap != (byte *)dest._M_str) &&
     (SmallBuffer::reserve((SmallBuffer *)local_e8.payload.heap,sVar8), sVar8 != 0)) {
    local_e8.payload.bufferSize = sVar8;
    memcpy(local_e8.payload.heap,dest._M_str,sVar8);
    sVar8 = local_e8.payload.bufferSize;
  }
  local_e8.payload.bufferSize = sVar8;
  bVar1 = (byte)(ppVar6->second).messageID;
  if (bVar1 < 0x70) {
    if (bVar1 == 0x65) {
      ActionMessage::setAction(&local_e8,(uint)(hint != FILTER) * 2 + cmd_add_named_filter);
      goto LAB_002b3714;
    }
    if (bVar1 == 0x66) {
      ActionMessage::setAction(&local_e8,cmd_add_named_endpoint);
      lVar2._0_4_ = (ppVar6->second).dest_id;
      lVar2._4_4_ = (ppVar6->second).dest_handle;
      if (lVar2 == 0) {
        puVar3 = *(undefined8 **)((ppVar6->second).payload.buffer._M_elems + 0x28);
        sVar8 = puVar3[1];
        if ((sVar8 != 0) ||
           (*(long *)(*(long *)((ppVar6->second).payload.buffer._M_elems + 0x30) + 8) != 0)) {
          puVar4 = *(undefined8 **)((ppVar6->second).payload.buffer._M_elems + 0x30);
          string1._M_str = (char *)*puVar3;
          string1._M_len = sVar8;
          string2._M_str = (char *)*puVar4;
          string2._M_len = puVar4[1];
          ActionMessage::setStringData(&local_e8,string1,string2);
        }
      }
      if (((ppVar6->second).messageID & 0x2000000) != 0) {
        local_e8._24_8_ = local_e8._24_8_ | 0x2000000;
      }
      goto LAB_002b376d;
    }
  }
  else {
    if (bVar1 == 0x70) {
      ActionMessage::setAction(&local_e8,cmd_add_named_input);
LAB_002b3714:
      lVar5._0_4_ = (ppVar6->second).dest_id;
      lVar5._4_4_ = (ppVar6->second).dest_handle;
      if (lVar5 == 0) {
        string1_00._M_str = (char *)(ppVar6->second).Te.internalTimeCode;
        string1_00._M_len = (ppVar6->second).Tdemin.internalTimeCode;
        string2_00._M_str = *(char **)((ppVar6->second).payload.buffer._M_elems + 8);
        string2_00._M_len = *(size_t *)((ppVar6->second).payload.buffer._M_elems + 0x10);
        ActionMessage::setStringData(&local_e8,string1_00,string2_00);
      }
LAB_002b376d:
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
      return;
    }
    if (bVar1 == 0x74) {
      newAction = cmd_add_named_input;
      if ((char)hint < 'i') {
        if (hint == ENDPOINT) {
          newAction = cmd_add_named_endpoint;
        }
        else {
          if (hint != FILTER) goto LAB_002b3743;
          newAction = cmd_add_named_filter;
        }
      }
      else if (hint != INPUT) {
        if (hint == PUBLICATION) {
          this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
          pcVar7 = "translators cannot have publications as destination targets";
          sVar8 = 0x3b;
          goto LAB_002b383a;
        }
LAB_002b3743:
        ActionMessage::setAction(&local_e8,cmd_add_named_endpoint);
        BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
      }
      ActionMessage::setAction(&local_e8,newAction);
      goto LAB_002b376d;
    }
    if (bVar1 == 0x73) {
      this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
      pcVar7 = "Data sinks cannot have destination targets";
      sVar8 = 0x2a;
      goto LAB_002b383a;
    }
  }
  this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
  pcVar7 = "inputs cannot have destination targets";
  sVar8 = 0x26;
LAB_002b383a:
  message_00._M_str = pcVar7;
  message_00._M_len = sVar8;
  HelicsException::HelicsException(this_01,message_00);
  *(undefined ***)this_01 = &PTR__HelicsException_004db060;
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::addDestinationTarget(InterfaceHandle handle,
                                      std::string_view dest,
                                      InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, receive_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.flags = handleInfo->flags;
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    setActionFlag(cmd, destination_target);
    cmd.payload = dest;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::INPUT:
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
                case InterfaceType::PUBLICATION:
                    throw(InvalidIdentifier(
                        "translators cannot have publications as destination targets"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators have two outputs
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    // need to send 2 messages then one now and one at the end
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_ADD_NAMED_INPUT);
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::SINK:
            throw(InvalidIdentifier("Data sinks cannot have destination targets"));
        case InterfaceType::INPUT:
        default:
            throw(InvalidIdentifier("inputs cannot have destination targets"));
    }

    addActionMessage(std::move(cmd));
}